

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t45(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long *plVar4;
  
  uVar2 = al_ustr_new("abcdef");
  uVar3 = al_ustr_new("ABCDEF");
  cVar1 = al_ustr_replace_range(uVar2,0xffffffff,1,uVar3);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_replace_range(us1, -1, 1, us2)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_replace_range(us1, -1, 1, us2)");
    error = error + 1;
  }
  cVar1 = al_ustr_replace_range(uVar2,8,100,uVar3);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_replace_range(us1, 8, 100, us2)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_replace_range(us1, 8, 100, us2)");
  }
  plVar4 = (long *)al_cstr(uVar2);
  if (*(long *)((long)plVar4 + 7) == 0x46454443424100 && *plVar4 == 0x666564636261) {
    log_printf("OK   %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
    error = error + 1;
  }
  cVar1 = al_ustr_replace_range(uVar2,8,1,uVar3);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_replace_range(us1, 8, 1, us2)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_replace_range(us1, 8, 1, us2)");
    error = error + 1;
  }
  plVar4 = (long *)al_cstr(uVar2);
  if (*(long *)((long)plVar4 + 7) == 0x46454443424100 && *plVar4 == 0x666564636261) {
    log_printf("OK   %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(al_cstr(us1), \"abcdef\\0\\0ABCDEF\", 15)");
    error = error + 1;
  }
  al_ustr_free(uVar2);
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t45(void)
{
   ALLEGRO_USTR *us1 = al_ustr_new("abcdef");
   ALLEGRO_USTR *us2 = al_ustr_new("ABCDEF");

   /* Start1 < 0 [not allowed] */
   CHECK(! al_ustr_replace_range(us1, -1, 1, us2));

   /* Start1 > end(us1) [padded] */
   CHECK(al_ustr_replace_range(us1, 8, 100, us2));
   CHECK(0 == memcmp(al_cstr(us1), "abcdef\0\0ABCDEF", 15));

   /* Start1 > end1 [not allowed] */
   CHECK(! al_ustr_replace_range(us1, 8, 1, us2));
   CHECK(0 == memcmp(al_cstr(us1), "abcdef\0\0ABCDEF", 15));

   al_ustr_free(us1);
   al_ustr_free(us2);
}